

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O0

bool __thiscall
tinyusdz::usdc::USDCReader::Impl::ReconstructPrimSpecNode
          (Impl *this,int parent,int current,int level,bool is_parent_variant,
          PathIndexToSpecIndexMap *psmap,Layer *layer,optional<tinyusdz::PrimSpec> *primOut)

{
  char cVar1;
  bool bVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  size_type sVar6;
  ostream *poVar7;
  reference pvVar8;
  size_type sVar9;
  size_type sVar10;
  mapped_type *this_00;
  LayerMetas *metas;
  value_type *pvVar11;
  value_type *pvVar12;
  string *psVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  string *psVar15;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar16;
  PropertyMap *pPVar17;
  PrimMeta *pPVar18;
  size_type sVar19;
  mapped_type *this_01;
  mapped_type *pmVar20;
  mapped_type *this_02;
  SpecType ty;
  SpecType ty_00;
  string local_5a10;
  ostringstream local_59f0 [8];
  ostringstream ss_e_26;
  string local_5878;
  string local_5858;
  allocator local_5831;
  string local_5830 [32];
  fmt local_5810 [32];
  ostringstream local_57f0 [8];
  ostringstream ss_e_25;
  string local_5678;
  string local_5658;
  allocator local_5631;
  string local_5630 [32];
  fmt local_5610 [32];
  ostringstream local_55f0 [8];
  ostringstream ss_e_24;
  string local_5478;
  ostringstream local_5458 [8];
  ostringstream ss_w;
  pair<tinyusdz::Path,_tinyusdz::Property> local_52e0;
  string local_4c30;
  allocator local_4c09;
  string local_4c08 [32];
  fmt local_4be8 [32];
  ostringstream local_4bc8 [8];
  ostringstream ss_e_23;
  undefined1 local_4a50 [8];
  Property prop;
  ostringstream local_4450 [8];
  ostringstream ss_e_22;
  optional<tinyusdz::Path> local_42d0;
  undefined1 local_41f8 [8];
  optional<tinyusdz::Path> path;
  ostringstream local_4100 [8];
  ostringstream ss_e_21;
  undefined1 local_3f88 [8];
  PropertyMap props_1;
  PrimSpec variantPrimSpec;
  allocator local_39c9;
  string local_39c8 [32];
  fmt local_39a8 [32];
  ostringstream local_3988 [8];
  ostringstream ss_e_20;
  undefined1 local_3810 [8];
  string variantPrimName;
  string variantSetName;
  allocator local_37a9;
  string local_37a8;
  string local_3788;
  ostringstream local_3768 [8];
  ostringstream ss_e_19;
  undefined1 local_35f0 [8];
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  variantPair;
  string local_35a8 [8];
  string primTypeName_1;
  string prim_name_1;
  string pTyName_1;
  optional<tinyusdz::Specifier> local_3540;
  string local_3538;
  ostringstream local_3518 [8];
  ostringstream ss_e_18;
  string local_33a0;
  ostringstream local_3380 [8];
  ostringstream ss_e_17;
  Index local_3204;
  optional<tinyusdz::Path> local_3200;
  optional<tinyusdz::Path> *local_3128;
  optional<tinyusdz::Path> *pv_3;
  Path elemPath_2;
  ostringstream local_3030 [8];
  ostringstream ss_e_16;
  undefined1 local_2eb8 [8];
  PrimMeta primMeta_1;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> properties_1;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> primChildren_1;
  optional<tinyusdz::Specifier> specifier_1;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  typeName_1;
  ostringstream local_2a40 [8];
  ostringstream ss_e_15;
  undefined1 local_28c8 [8];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> variantChildren;
  ostringstream local_2890 [8];
  ostringstream ss_e_14;
  string local_2718;
  allocator local_26f1;
  string local_26f0;
  string local_26d0;
  ostringstream local_26b0 [8];
  ostringstream ss_e_13;
  string local_2538;
  Index local_2514;
  optional<tinyusdz::Path> local_2510;
  optional<tinyusdz::Path> *local_2438;
  optional<tinyusdz::Path> *pv_2;
  Path elemPath_1;
  ostringstream local_2340 [8];
  ostringstream ss_e_12;
  string local_21b8;
  ostringstream local_2198 [8];
  ostringstream ss_e_11;
  undefined1 local_2020 [8];
  PropertyMap props;
  PrimSpec primspec;
  ostringstream local_1a68 [8];
  ostringstream ss_e_10;
  allocator local_18e9;
  string local_18e8 [8];
  string primTypeName;
  string prim_name;
  string pTyName;
  optional<tinyusdz::Specifier> local_1880;
  string local_1878;
  ostringstream local_1858 [8];
  ostringstream ss_e_9;
  string local_16e0;
  ostringstream local_16c0 [8];
  ostringstream ss_e_8;
  Index local_1544;
  optional<tinyusdz::Path> local_1540;
  optional<tinyusdz::Path> *local_1468;
  optional<tinyusdz::Path> *pv_1;
  Path elemPath;
  ostringstream local_1370 [8];
  ostringstream ss_e_7;
  undefined1 local_11f8 [8];
  PrimMeta primMeta;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> properties;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> primChildren;
  optional<tinyusdz::Specifier> specifier;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  typeName;
  ostringstream local_d80 [8];
  ostringstream ss_e_6;
  string local_bf8;
  ostringstream local_bd8 [8];
  ostringstream ss_e_5;
  string local_a60;
  ostringstream local_a40 [8];
  ostringstream ss_e_4;
  int local_8c4;
  string local_8c0;
  ostringstream local_8a0 [8];
  ostringstream ss_e_3;
  Index local_724;
  optional<tinyusdz::Path> local_720;
  optional<tinyusdz::Path> *local_648;
  optional<tinyusdz::Path> *pv;
  ostringstream local_620 [8];
  ostringstream ss_e_2;
  FieldValuePairVector *fvs;
  string local_480;
  string local_460 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440 [32];
  ostringstream local_420 [8];
  ostringstream ss_e_1;
  Spec *spec;
  __cxx11 local_280 [32];
  string local_260;
  string local_240 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0 [32];
  ostringstream local_1c0 [8];
  ostringstream ss_e;
  uint32_t local_44;
  uint local_40;
  uint32_t local_3c;
  uint32_t spec_index;
  Node *node;
  PathIndexToSpecIndexMap *psmap_local;
  uint32_t uStack_20;
  bool is_parent_variant_local;
  int level_local;
  int current_local;
  int parent_local;
  Impl *this_local;
  
  node = (Node *)psmap;
  psmap_local._3_1_ = is_parent_variant;
  psmap_local._4_4_ = level;
  uStack_20 = current;
  level_local = parent;
  _current_local = this;
  _spec_index = ::std::
                vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                ::operator[](&this->_nodes,(long)current);
  local_3c = uStack_20;
  sVar3 = ::std::
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          ::count((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)node,&local_3c);
  if (sVar3 == 0) {
    this_local._7_1_ = 1;
    goto LAB_001e4f2e;
  }
  local_44 = uStack_20;
  pmVar4 = ::std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::at((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 *)node,&local_44);
  local_40 = *pmVar4;
  uVar5 = (ulong)local_40;
  sVar6 = ::std::vector<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>::size
                    (&this->_specs);
  if (sVar6 <= uVar5) {
    ::std::__cxx11::ostringstream::ostringstream(local_1c0);
    poVar7 = ::std::operator<<((ostream *)local_1c0,"[error]");
    poVar7 = ::std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                              );
    poVar7 = ::std::operator<<(poVar7,":");
    poVar7 = ::std::operator<<(poVar7,"ReconstructPrimSpecNode");
    poVar7 = ::std::operator<<(poVar7,"():");
    poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xafd);
    ::std::operator<<(poVar7," ");
    ::std::__cxx11::to_string(&local_260,local_40);
    ::std::operator+((char *)local_240,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "Invalid specifier id: ");
    ::std::operator+(local_220,(char *)local_240);
    sVar6 = ::std::vector<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>::size
                      (&this->_specs);
    std::__cxx11::to_string(local_280,sVar6);
    ::std::operator+(local_200,local_220);
    ::std::operator+(local_1e0,(char *)local_200);
    poVar7 = ::std::operator<<((ostream *)local_1c0,(string *)local_1e0);
    ::std::operator<<(poVar7,"\n");
    ::std::__cxx11::string::~string((string *)local_1e0);
    ::std::__cxx11::string::~string((string *)local_200);
    ::std::__cxx11::string::~string((string *)local_280);
    ::std::__cxx11::string::~string((string *)local_220);
    ::std::__cxx11::string::~string(local_240);
    ::std::__cxx11::string::~string((string *)&local_260);
    ::std::__cxx11::ostringstream::str();
    PushError(this,(string *)&spec);
    ::std::__cxx11::string::~string((string *)&spec);
    ::std::__cxx11::ostringstream::~ostringstream(local_1c0);
    this_local._7_1_ = 0;
    goto LAB_001e4f2e;
  }
  pvVar8 = ::std::vector<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>::operator[]
                     (&this->_specs,(ulong)local_40);
  if (((pvVar8->spec_type == Attribute) || (pvVar8->spec_type == Relationship)) &&
     (sVar9 = ::std::set<int,_std::less<int>,_std::allocator<int>_>::count
                        (&this->_prim_table,&level_local), sVar9 != 0)) {
    this_local._7_1_ = 1;
    goto LAB_001e4f2e;
  }
  sVar10 = ::std::
           map<tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>,_std::less<tinyusdz::crate::Index>,_std::allocator<std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>_>_>
           ::count(&this->_live_fieldsets,&pvVar8->fieldset_index);
  if (sVar10 == 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_420);
    poVar7 = ::std::operator<<((ostream *)local_420,"[error]");
    poVar7 = ::std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                              );
    poVar7 = ::std::operator<<(poVar7,":");
    poVar7 = ::std::operator<<(poVar7,"ReconstructPrimSpecNode");
    poVar7 = ::std::operator<<(poVar7,"():");
    poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xb13);
    ::std::operator<<(poVar7," ");
    ::std::__cxx11::to_string(&local_480,(pvVar8->fieldset_index).value);
    ::std::operator+((char *)local_460,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "FieldSet id: ");
    ::std::operator+(local_440,(char *)local_460);
    poVar7 = ::std::operator<<((ostream *)local_420,(string *)local_440);
    ::std::operator<<(poVar7,"\n");
    ::std::__cxx11::string::~string((string *)local_440);
    ::std::__cxx11::string::~string(local_460);
    ::std::__cxx11::string::~string((string *)&local_480);
    ::std::__cxx11::ostringstream::str();
    PushError(this,(string *)&fvs);
    ::std::__cxx11::string::~string((string *)&fvs);
    ::std::__cxx11::ostringstream::~ostringstream(local_420);
    this_local._7_1_ = 0;
    goto LAB_001e4f2e;
  }
  this_00 = ::std::
            map<tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>,_std::less<tinyusdz::crate::Index>,_std::allocator<std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>_>_>
            ::at(&this->_live_fieldsets,&pvVar8->fieldset_index);
  sVar6 = ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
          ::size(this_00);
  if ((this->_config).kMaxFieldValuePairs < sVar6) {
    ::std::__cxx11::ostringstream::ostringstream(local_620);
    poVar7 = ::std::operator<<((ostream *)local_620,"[error]");
    poVar7 = ::std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                              );
    poVar7 = ::std::operator<<(poVar7,"[USDC]");
    poVar7 = ::std::operator<<(poVar7,":");
    poVar7 = ::std::operator<<(poVar7,"ReconstructPrimSpecNode");
    poVar7 = ::std::operator<<(poVar7,"():");
    poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xb1b);
    ::std::operator<<(poVar7," ");
    poVar7 = ::std::operator<<((ostream *)local_620,"Too much FieldValue pairs.");
    ::std::operator<<(poVar7,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,(string *)&pv);
    ::std::__cxx11::string::~string((string *)&pv);
    this_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_620);
    goto LAB_001e4f2e;
  }
  if (uStack_20 == 0) {
    crate::Index::Index(&local_724,0);
    GetElemPath(&local_720,this,local_724);
    local_648 = &local_720;
    bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_648);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream(local_8a0);
      poVar7 = ::std::operator<<((ostream *)local_8a0,"[error]");
      poVar7 = ::std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar7 = ::std::operator<<(poVar7,":");
      poVar7 = ::std::operator<<(poVar7,"ReconstructPrimSpecNode");
      poVar7 = ::std::operator<<(poVar7,"():");
      poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xb2c);
      ::std::operator<<(poVar7," ");
      poVar7 = ::std::operator<<((ostream *)local_8a0,
                                 "(Internal error). Root Element Path not found.");
      ::std::operator<<(poVar7,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_8c0);
      ::std::__cxx11::string::~string((string *)&local_8c0);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_8a0);
    }
    nonstd::optional_lite::optional<tinyusdz::Path>::~optional(&local_720);
    if (bVar2) {
      if (pvVar8->spec_type == PseudoRoot) {
        metas = Layer::metas(layer);
        bVar2 = ReconstrcutStageMeta(this,this_00,metas);
        if (bVar2) {
          ::std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    (&this->_prim_table,(value_type_conflict7 *)&stack0xffffffffffffffe0);
          this_local._7_1_ = 1;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_bd8);
          poVar7 = ::std::operator<<((ostream *)local_bd8,"[error]");
          poVar7 = ::std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar7 = ::std::operator<<(poVar7,":");
          poVar7 = ::std::operator<<(poVar7,"ReconstructPrimSpecNode");
          poVar7 = ::std::operator<<(poVar7,"():");
          poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xb36);
          ::std::operator<<(poVar7," ");
          poVar7 = ::std::operator<<((ostream *)local_bd8,"Failed to reconstruct StageMeta.");
          ::std::operator<<(poVar7,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,&local_bf8);
          ::std::__cxx11::string::~string((string *)&local_bf8);
          this_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_bd8);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_a40);
        poVar7 = ::std::operator<<((ostream *)local_a40,"[error]");
        poVar7 = ::std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                  );
        poVar7 = ::std::operator<<(poVar7,":");
        poVar7 = ::std::operator<<(poVar7,"ReconstructPrimSpecNode");
        poVar7 = ::std::operator<<(poVar7,"():");
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xb32);
        ::std::operator<<(poVar7," ");
        poVar7 = ::std::operator<<((ostream *)local_a40,
                                   "SpecTypePseudoRoot expected for root layer(Stage) element.");
        ::std::operator<<(poVar7,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_a60);
        ::std::__cxx11::string::~string((string *)&local_a60);
        this_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_a40);
      }
    }
    goto LAB_001e4f2e;
  }
  switch(pvVar8->spec_type) {
  case Unknown:
  case Invalid:
    ::std::__cxx11::ostringstream::ostringstream(local_59f0);
    poVar7 = ::std::operator<<((ostream *)local_59f0,"[error]");
    poVar7 = ::std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                              );
    poVar7 = ::std::operator<<(poVar7,"[USDC]");
    poVar7 = ::std::operator<<(poVar7,":");
    poVar7 = ::std::operator<<(poVar7,"ReconstructPrimSpecNode");
    poVar7 = ::std::operator<<(poVar7,"():");
    poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xcc8);
    ::std::operator<<(poVar7," ");
    poVar7 = ::std::operator<<((ostream *)local_59f0,"[InternalError] Invalid SpecType.");
    ::std::operator<<(poVar7,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_5a10);
    ::std::__cxx11::string::~string((string *)&local_5a10);
    this_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_59f0);
    goto LAB_001e4f2e;
  case Attribute:
    if ((psmap_local._3_1_ & 1) == 0) {
      ::std::__cxx11::ostringstream::ostringstream(local_5458);
      poVar7 = ::std::operator<<((ostream *)local_5458,"[warn]");
      poVar7 = ::std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar7 = ::std::operator<<(poVar7,":");
      poVar7 = ::std::operator<<(poVar7,"ReconstructPrimSpecNode");
      poVar7 = ::std::operator<<(poVar7,"():");
      poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xcb3);
      ::std::operator<<(poVar7," ");
      poVar7 = ::std::operator<<((ostream *)local_5458,
                                 "TODO: SpecTypeAttribute(in conjunction with Class/Over specifier, or inherited?)"
                                );
      ::std::operator<<(poVar7,"\n");
      ::std::__cxx11::ostringstream::str();
      PushWarn(this,&local_5478);
      ::std::__cxx11::string::~string((string *)&local_5478);
      ::std::__cxx11::ostringstream::~ostringstream(local_5458);
    }
    else {
      GetPath(&local_42d0,this,(Index)(pvVar8->path_index).value);
      nonstd::optional_lite::optional<tinyusdz::Path>::optional<tinyusdz::Path,_0>
                ((optional<tinyusdz::Path> *)local_41f8,&local_42d0);
      nonstd::optional_lite::optional<tinyusdz::Path>::~optional(&local_42d0);
      bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_41f8);
      if (bVar2) {
        Property::Property((Property *)local_4a50);
        bVar2 = ParseProperty(this,pvVar8->spec_type,this_00,(Property *)local_4a50);
        if (bVar2) {
          pvVar11 = nonstd::optional_lite::optional<tinyusdz::Path>::value
                              ((optional<tinyusdz::Path> *)local_41f8);
          ::std::pair<tinyusdz::Path,_tinyusdz::Property>::
          pair<tinyusdz::Path_&,_tinyusdz::Property_&,_true>
                    (&local_52e0,pvVar11,(Property *)local_4a50);
          this_02 = ::std::
                    map<int,_std::pair<tinyusdz::Path,_tinyusdz::Property>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>_>
                    ::operator[](&this->_variantProps,(key_type_conflict2 *)&stack0xffffffffffffffe0
                                );
          ::std::pair<tinyusdz::Path,_tinyusdz::Property>::operator=(this_02,&local_52e0);
          ::std::pair<tinyusdz::Path,_tinyusdz::Property>::~pair(&local_52e0);
          pmVar20 = ::std::
                    map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::operator[](&this->_variantPropChildren,&level_local);
          ::std::vector<int,_std::allocator<int>_>::push_back
                    (pmVar20,(value_type_conflict7 *)&stack0xffffffffffffffe0);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_4bc8);
          poVar7 = ::std::operator<<((ostream *)local_4bc8,"[error]");
          poVar7 = ::std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar7 = ::std::operator<<(poVar7,"[USDC]");
          poVar7 = ::std::operator<<(poVar7,":");
          poVar7 = ::std::operator<<(poVar7,"ReconstructPrimSpecNode");
          poVar7 = ::std::operator<<(poVar7,"():");
          poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xca3);
          ::std::operator<<(poVar7," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_4c08,"Failed to parse Attribut: {}.",&local_4c09);
          pvVar11 = nonstd::optional_lite::optional<tinyusdz::Path>::value
                              ((optional<tinyusdz::Path> *)local_41f8);
          psVar13 = Path::prop_part_abi_cxx11_(pvVar11);
          fmt::format<std::__cxx11::string>
                    (local_4be8,(string *)local_4c08,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar13);
          poVar7 = ::std::operator<<((ostream *)local_4bc8,(string *)local_4be8);
          ::std::operator<<(poVar7,"\n");
          ::std::__cxx11::string::~string((string *)local_4be8);
          ::std::__cxx11::string::~string(local_4c08);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_4c09);
          ::std::__cxx11::ostringstream::str();
          PushError(this,&local_4c30);
          ::std::__cxx11::string::~string((string *)&local_4c30);
          this_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_4bc8);
        }
        bVar2 = !bVar2;
        Property::~Property((Property *)local_4a50);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_4450);
        poVar7 = ::std::operator<<((ostream *)local_4450,"[error]");
        poVar7 = ::std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                  );
        poVar7 = ::std::operator<<(poVar7,"[USDC]");
        poVar7 = ::std::operator<<(poVar7,":");
        poVar7 = ::std::operator<<(poVar7,"ReconstructPrimSpecNode");
        poVar7 = ::std::operator<<(poVar7,"():");
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xc9c);
        ::std::operator<<(poVar7," ");
        poVar7 = ::std::operator<<((ostream *)local_4450,"Invalid PathIndex.");
        ::std::operator<<(poVar7,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&prop._has_custom);
        ::std::__cxx11::string::~string((string *)&prop._has_custom);
        this_local._7_1_ = 0;
        bVar2 = true;
        ::std::__cxx11::ostringstream::~ostringstream(local_4450);
      }
      nonstd::optional_lite::optional<tinyusdz::Path>::~optional
                ((optional<tinyusdz::Path> *)local_41f8);
      if (bVar2) goto LAB_001e4f2e;
    }
    break;
  case Connection:
  case Relationship:
  case RelationshipTarget:
    ::std::__cxx11::ostringstream::ostringstream(local_55f0);
    poVar7 = ::std::operator<<((ostream *)local_55f0,"[error]");
    poVar7 = ::std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                              );
    poVar7 = ::std::operator<<(poVar7,"[USDC]");
    poVar7 = ::std::operator<<(poVar7,":");
    poVar7 = ::std::operator<<(poVar7,"ReconstructPrimSpecNode");
    poVar7 = ::std::operator<<(poVar7,"():");
    poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xcbc);
    ::std::operator<<(poVar7," ");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_5630,"TODO: Unsupported/Unimplemented SpecType: {}.",&local_5631);
    tinyusdz::to_string_abi_cxx11_(&local_5658,(tinyusdz *)(ulong)pvVar8->spec_type,ty);
    fmt::format<std::__cxx11::string>
              (local_5610,(string *)local_5630,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_5658);
    poVar7 = ::std::operator<<((ostream *)local_55f0,(string *)local_5610);
    ::std::operator<<(poVar7,"\n");
    ::std::__cxx11::string::~string((string *)local_5610);
    ::std::__cxx11::string::~string((string *)&local_5658);
    ::std::__cxx11::string::~string(local_5630);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_5631);
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_5678);
    ::std::__cxx11::string::~string((string *)&local_5678);
    this_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_55f0);
    goto LAB_001e4f2e;
  case Expression:
  case Mapper:
  case MapperArg:
    ::std::__cxx11::ostringstream::ostringstream(local_57f0);
    poVar7 = ::std::operator<<((ostream *)local_57f0,"[error]");
    poVar7 = ::std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                              );
    poVar7 = ::std::operator<<(poVar7,"[USDC]");
    poVar7 = ::std::operator<<(poVar7,":");
    poVar7 = ::std::operator<<(poVar7,"ReconstructPrimSpecNode");
    poVar7 = ::std::operator<<(poVar7,"():");
    poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xcc3);
    ::std::operator<<(poVar7," ");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_5830,"Unsupported SpecType: {}.",&local_5831);
    tinyusdz::to_string_abi_cxx11_(&local_5858,(tinyusdz *)(ulong)pvVar8->spec_type,ty_00);
    fmt::format<std::__cxx11::string>
              (local_5810,(string *)local_5830,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_5858);
    poVar7 = ::std::operator<<((ostream *)local_57f0,(string *)local_5810);
    ::std::operator<<(poVar7,"\n");
    ::std::__cxx11::string::~string((string *)local_5810);
    ::std::__cxx11::string::~string((string *)&local_5858);
    ::std::__cxx11::string::~string(local_5830);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_5831);
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_5878);
    ::std::__cxx11::string::~string((string *)&local_5878);
    this_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_57f0);
    goto LAB_001e4f2e;
  case Prim:
    nonstd::optional_lite::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&specifier);
    nonstd::optional_lite::optional<tinyusdz::Specifier>::optional
              ((optional<tinyusdz::Specifier> *)
               &primChildren.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
               &properties.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
               ((long)&primMeta.variantSetChildren.contained + 0x10));
    PrimMetas::PrimMetas((PrimMetas *)local_11f8);
    bVar2 = ParsePrimSpec(this,this_00,
                          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&specifier,
                          (optional<tinyusdz::Specifier> *)
                          &primChildren.
                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                          &properties.
                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                          ((long)&primMeta.variantSetChildren.contained + 0x10),
                          (PrimMeta *)local_11f8);
    if (bVar2) {
      Path::Path((Path *)&pv_1);
      crate::Index::Index(&local_1544,uStack_20);
      GetElemPath(&local_1540,this,local_1544);
      local_1468 = &local_1540;
      bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_1468);
      if (bVar2) {
        pvVar11 = nonstd::optional_lite::optional<tinyusdz::Path>::value(local_1468);
        Path::operator=((Path *)&pv_1,pvVar11);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_16c0);
        poVar7 = ::std::operator<<((ostream *)local_16c0,"[error]");
        poVar7 = ::std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                  );
        poVar7 = ::std::operator<<(poVar7,"[USDC]");
        poVar7 = ::std::operator<<(poVar7,":");
        poVar7 = ::std::operator<<(poVar7,"ReconstructPrimSpecNode");
        poVar7 = ::std::operator<<(poVar7,"():");
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xb5d);
        ::std::operator<<(poVar7," ");
        poVar7 = ::std::operator<<((ostream *)local_16c0,"(Internal errror) Element path not found."
                                  );
        ::std::operator<<(poVar7,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_16e0);
        ::std::__cxx11::string::~string((string *)&local_16e0);
        this_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_16c0);
      }
      cVar1 = !bVar2;
      nonstd::optional_lite::optional<tinyusdz::Path>::~optional(&local_1540);
      if (!(bool)cVar1) {
        bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool
                          ((optional *)
                           &primChildren.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar2) {
          pvVar12 = nonstd::optional_lite::optional<tinyusdz::Specifier>::value
                              ((optional<tinyusdz::Specifier> *)
                               &primChildren.
                                super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (((*pvVar12 != Def) &&
              (pvVar12 = nonstd::optional_lite::optional<tinyusdz::Specifier>::value
                                   ((optional<tinyusdz::Specifier> *)
                                    &primChildren.
                                     super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage),
              *pvVar12 != Class)) &&
             (pvVar12 = nonstd::optional_lite::optional<tinyusdz::Specifier>::value
                                  ((optional<tinyusdz::Specifier> *)
                                   &primChildren.
                                    super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage),
             *pvVar12 != Over)) {
            ::std::__cxx11::ostringstream::ostringstream(local_1858);
            poVar7 = ::std::operator<<((ostream *)local_1858,"[error]");
            poVar7 = ::std::operator<<(poVar7,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                      );
            poVar7 = ::std::operator<<(poVar7,"[USDC]");
            poVar7 = ::std::operator<<(poVar7,":");
            poVar7 = ::std::operator<<(poVar7,"ReconstructPrimSpecNode");
            poVar7 = ::std::operator<<(poVar7,"():");
            poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xb69);
            ::std::operator<<(poVar7," ");
            poVar7 = ::std::operator<<((ostream *)local_1858,"Invalid Specifier.");
            ::std::operator<<(poVar7,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,&local_1878);
            ::std::__cxx11::string::~string((string *)&local_1878);
            this_local._7_1_ = 0;
            cVar1 = '\x01';
            ::std::__cxx11::ostringstream::~ostringstream(local_1858);
            goto LAB_001e3470;
          }
        }
        else {
          pTyName.field_2._12_4_ = 1;
          nonstd::optional_lite::optional<tinyusdz::Specifier>::optional<tinyusdz::Specifier,_0>
                    (&local_1880,(Specifier *)(pTyName.field_2._M_local_buf + 0xc));
          nonstd::optional_lite::optional<tinyusdz::Specifier>::operator=
                    ((optional<tinyusdz::Specifier> *)
                     &primChildren.
                      super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,&local_1880);
          nonstd::optional_lite::optional<tinyusdz::Specifier>::~optional(&local_1880);
        }
        ::std::__cxx11::string::string((string *)(prim_name.field_2._M_local_buf + 8));
        bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&specifier);
        if (bVar2) {
          psVar15 = (string *)
                    nonstd::optional_lite::
                    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&specifier);
          ::std::__cxx11::string::operator=((string *)(prim_name.field_2._M_local_buf + 8),psVar15);
        }
        else {
          ::std::__cxx11::string::operator=((string *)(prim_name.field_2._M_local_buf + 8),"Model");
        }
        psVar13 = Path::prim_part_abi_cxx11_((Path *)&pv_1);
        ::std::__cxx11::string::string
                  ((string *)(primTypeName.field_2._M_local_buf + 8),(string *)psVar13);
        bVar2 = nonstd::optional_lite::
                optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::has_value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&specifier);
        if (bVar2) {
          psVar15 = (string *)
                    nonstd::optional_lite::
                    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&specifier);
          ::std::__cxx11::string::string(local_18e8,psVar15);
        }
        else {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_18e8,"",&local_18e9);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_18e9);
        }
        bVar2 = nonstd::optional_lite::
                optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::has_value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&specifier);
        if (bVar2) {
          pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    nonstd::optional_lite::
                    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&specifier);
          bVar2 = ::std::operator==(pbVar14,"__AnyType__");
          if (bVar2) {
            ::std::__cxx11::string::operator=(local_18e8,"");
          }
        }
        bVar2 = ValidatePrimElementName((string *)((long)&primTypeName.field_2 + 8));
        if (bVar2) {
          PrimSpec::PrimSpec((PrimSpec *)&props._M_t._M_impl.super__Rb_tree_header._M_node_count);
          psVar13 = PrimSpec::typeName_abi_cxx11_
                              ((PrimSpec *)&props._M_t._M_impl.super__Rb_tree_header._M_node_count);
          ::std::__cxx11::string::operator=((string *)psVar13,local_18e8);
          psVar13 = PrimSpec::name_abi_cxx11_
                              ((PrimSpec *)&props._M_t._M_impl.super__Rb_tree_header._M_node_count);
          ::std::__cxx11::string::operator=
                    ((string *)psVar13,(string *)(primTypeName.field_2._M_local_buf + 8));
          ::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                 *)local_2020);
          pvVar16 = crate::CrateReader::Node::GetChildren(_spec_index);
          bVar2 = BuildPropertyMap(this,pvVar16,(PathIndexToSpecIndexMap *)node,
                                   (PropertyMap *)local_2020);
          if (bVar2) {
            pPVar17 = PrimSpec::props_abi_cxx11_
                                ((PrimSpec *)&props._M_t._M_impl.super__Rb_tree_header._M_node_count
                                );
            ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
            ::operator=(pPVar17,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                 *)local_2020);
            pPVar18 = PrimSpec::metas((PrimSpec *)
                                      &props._M_t._M_impl.super__Rb_tree_header._M_node_count);
            PrimMetas::operator=(pPVar18,(PrimMetas *)local_11f8);
            if (primOut != (optional<tinyusdz::PrimSpec> *)0x0) {
              nonstd::optional_lite::optional<tinyusdz::PrimSpec>::operator=
                        (primOut,(PrimSpec *)&props._M_t._M_impl.super__Rb_tree_header._M_node_count
                        );
            }
            cVar1 = '\0';
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_2198);
            poVar7 = ::std::operator<<((ostream *)local_2198,"[error]");
            poVar7 = ::std::operator<<(poVar7,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                      );
            poVar7 = ::std::operator<<(poVar7,"[USDC]");
            poVar7 = ::std::operator<<(poVar7,":");
            poVar7 = ::std::operator<<(poVar7,"ReconstructPrimSpecNode");
            poVar7 = ::std::operator<<(poVar7,"():");
            poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xba8);
            ::std::operator<<(poVar7," ");
            poVar7 = ::std::operator<<((ostream *)local_2198,"Failed to build PropertyMap.");
            ::std::operator<<(poVar7,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,&local_21b8);
            ::std::__cxx11::string::~string((string *)&local_21b8);
            this_local._7_1_ = 0;
            cVar1 = '\x01';
            ::std::__cxx11::ostringstream::~ostringstream(local_2198);
          }
          ::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                  *)local_2020);
          PrimSpec::~PrimSpec((PrimSpec *)&props._M_t._M_impl.super__Rb_tree_header._M_node_count);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_1a68);
          poVar7 = ::std::operator<<((ostream *)local_1a68,"[error]");
          poVar7 = ::std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar7 = ::std::operator<<(poVar7,"[USDC]");
          poVar7 = ::std::operator<<(poVar7,":");
          poVar7 = ::std::operator<<(poVar7,"ReconstructPrimSpecNode");
          poVar7 = ::std::operator<<(poVar7,"():");
          poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xb84);
          ::std::operator<<(poVar7," ");
          poVar7 = ::std::operator<<((ostream *)local_1a68,"Invalid Prim name.");
          ::std::operator<<(poVar7,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,(string *)
                         &primspec._asset_search_paths.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
          ::std::__cxx11::string::~string
                    ((string *)
                     &primspec._asset_search_paths.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          this_local._7_1_ = 0;
          cVar1 = '\x01';
          ::std::__cxx11::ostringstream::~ostringstream(local_1a68);
        }
        ::std::__cxx11::string::~string(local_18e8);
        ::std::__cxx11::string::~string((string *)(primTypeName.field_2._M_local_buf + 8));
        if (cVar1 == '\0') {
          sVar9 = ::std::set<int,_std::less<int>,_std::allocator<int>_>::count
                            (&this->_prim_table,(key_type_conflict2 *)&stack0xffffffffffffffe0);
          if (sVar9 == 0) {
            ::std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      (&this->_prim_table,(value_type_conflict7 *)&stack0xffffffffffffffe0);
          }
          cVar1 = '\x0e';
        }
        ::std::__cxx11::string::~string((string *)(prim_name.field_2._M_local_buf + 8));
      }
LAB_001e3470:
      Path::~Path((Path *)&pv_1);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_1370);
      poVar7 = ::std::operator<<((ostream *)local_1370,"[error]");
      poVar7 = ::std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar7 = ::std::operator<<(poVar7,"[USDC]");
      poVar7 = ::std::operator<<(poVar7,":");
      poVar7 = ::std::operator<<(poVar7,"ReconstructPrimSpecNode");
      poVar7 = ::std::operator<<(poVar7,"():");
      poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xb50);
      ::std::operator<<(poVar7," ");
      poVar7 = ::std::operator<<((ostream *)local_1370,"Failed to parse Prim fields.");
      ::std::operator<<(poVar7,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)&elemPath._valid);
      ::std::__cxx11::string::~string((string *)&elemPath._valid);
      this_local._7_1_ = 0;
      cVar1 = '\x01';
      ::std::__cxx11::ostringstream::~ostringstream(local_1370);
    }
    PrimMetas::~PrimMetas((PrimMetas *)local_11f8);
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
               ((long)&primMeta.variantSetChildren.contained + 0x10));
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
               &properties.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    nonstd::optional_lite::optional<tinyusdz::Specifier>::~optional
              ((optional<tinyusdz::Specifier> *)
               &primChildren.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    nonstd::optional_lite::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&specifier);
    goto joined_r0x001e468d;
  case PseudoRoot:
    ::std::__cxx11::ostringstream::ostringstream(local_d80);
    poVar7 = ::std::operator<<((ostream *)local_d80,"[error]");
    poVar7 = ::std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                              );
    poVar7 = ::std::operator<<(poVar7,"[USDC]");
    poVar7 = ::std::operator<<(poVar7,":");
    poVar7 = ::std::operator<<(poVar7,"ReconstructPrimSpecNode");
    poVar7 = ::std::operator<<(poVar7,"():");
    poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xb43);
    ::std::operator<<(poVar7," ");
    poVar7 = ::std::operator<<((ostream *)local_d80,
                               "SpecType PseudoRoot in a child node is not supported(yet)");
    ::std::operator<<(poVar7,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,(string *)((long)&typeName.contained + 0x18));
    ::std::__cxx11::string::~string((string *)((long)&typeName.contained + 0x18));
    this_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_d80);
    goto LAB_001e4f2e;
  case Variant:
    nonstd::optional_lite::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&specifier_1);
    nonstd::optional_lite::optional<tinyusdz::Specifier>::optional
              ((optional<tinyusdz::Specifier> *)
               &primChildren_1.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
               &properties_1.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
               ((long)&primMeta_1.variantSetChildren.contained + 0x10));
    PrimMetas::PrimMetas((PrimMetas *)local_2eb8);
    bVar2 = ParsePrimSpec(this,this_00,
                          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&specifier_1,
                          (optional<tinyusdz::Specifier> *)
                          &primChildren_1.
                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                          &properties_1.
                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                          ((long)&primMeta_1.variantSetChildren.contained + 0x10),
                          (PrimMeta *)local_2eb8);
    if (bVar2) {
      Path::Path((Path *)&pv_3);
      crate::Index::Index(&local_3204,uStack_20);
      GetElemPath(&local_3200,this,local_3204);
      local_3128 = &local_3200;
      bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_3128);
      if (bVar2) {
        pvVar11 = nonstd::optional_lite::optional<tinyusdz::Path>::value(local_3128);
        Path::operator=((Path *)&pv_3,pvVar11);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_3380);
        poVar7 = ::std::operator<<((ostream *)local_3380,"[error]");
        poVar7 = ::std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                  );
        poVar7 = ::std::operator<<(poVar7,"[USDC]");
        poVar7 = ::std::operator<<(poVar7,":");
        poVar7 = ::std::operator<<(poVar7,"ReconstructPrimSpecNode");
        poVar7 = ::std::operator<<(poVar7,"():");
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xc0f);
        ::std::operator<<(poVar7," ");
        poVar7 = ::std::operator<<((ostream *)local_3380,"(Internal errror) Element path not found."
                                  );
        ::std::operator<<(poVar7,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_33a0);
        ::std::__cxx11::string::~string((string *)&local_33a0);
        this_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_3380);
      }
      cVar1 = !bVar2;
      nonstd::optional_lite::optional<tinyusdz::Path>::~optional(&local_3200);
      if (!(bool)cVar1) {
        bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool
                          ((optional *)
                           &primChildren_1.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar2) {
          pvVar12 = nonstd::optional_lite::optional<tinyusdz::Specifier>::value
                              ((optional<tinyusdz::Specifier> *)
                               &primChildren_1.
                                super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (((*pvVar12 != Def) &&
              (pvVar12 = nonstd::optional_lite::optional<tinyusdz::Specifier>::value
                                   ((optional<tinyusdz::Specifier> *)
                                    &primChildren_1.
                                     super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage),
              *pvVar12 != Class)) &&
             (pvVar12 = nonstd::optional_lite::optional<tinyusdz::Specifier>::value
                                  ((optional<tinyusdz::Specifier> *)
                                   &primChildren_1.
                                    super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage),
             *pvVar12 != Over)) {
            ::std::__cxx11::ostringstream::ostringstream(local_3518);
            poVar7 = ::std::operator<<((ostream *)local_3518,"[error]");
            poVar7 = ::std::operator<<(poVar7,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                      );
            poVar7 = ::std::operator<<(poVar7,"[USDC]");
            poVar7 = ::std::operator<<(poVar7,":");
            poVar7 = ::std::operator<<(poVar7,"ReconstructPrimSpecNode");
            poVar7 = ::std::operator<<(poVar7,"():");
            poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xc1b);
            ::std::operator<<(poVar7," ");
            poVar7 = ::std::operator<<((ostream *)local_3518,"Invalid Specifier.");
            ::std::operator<<(poVar7,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,&local_3538);
            ::std::__cxx11::string::~string((string *)&local_3538);
            this_local._7_1_ = 0;
            cVar1 = '\x01';
            ::std::__cxx11::ostringstream::~ostringstream(local_3518);
            goto LAB_001e463c;
          }
        }
        else {
          pTyName_1.field_2._12_4_ = 0;
          nonstd::optional_lite::optional<tinyusdz::Specifier>::optional<tinyusdz::Specifier,_0>
                    (&local_3540,(Specifier *)(pTyName_1.field_2._M_local_buf + 0xc));
          nonstd::optional_lite::optional<tinyusdz::Specifier>::operator=
                    ((optional<tinyusdz::Specifier> *)
                     &primChildren_1.
                      super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,&local_3540);
          nonstd::optional_lite::optional<tinyusdz::Specifier>::~optional(&local_3540);
        }
        ::std::__cxx11::string::string((string *)(prim_name_1.field_2._M_local_buf + 8));
        bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&specifier_1);
        if (bVar2) {
          psVar15 = (string *)
                    nonstd::optional_lite::
                    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&specifier_1);
          ::std::__cxx11::string::operator=
                    ((string *)(prim_name_1.field_2._M_local_buf + 8),psVar15);
        }
        else {
          ::std::__cxx11::string::operator=
                    ((string *)(prim_name_1.field_2._M_local_buf + 8),"Model");
        }
        psVar13 = Path::prim_part_abi_cxx11_((Path *)&pv_3);
        ::std::__cxx11::string::string
                  ((string *)(primTypeName_1.field_2._M_local_buf + 8),(string *)psVar13);
        bVar2 = nonstd::optional_lite::
                optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::has_value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&specifier_1);
        variantPair._62_1_ = 0;
        if (bVar2) {
          psVar15 = (string *)
                    nonstd::optional_lite::
                    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&specifier_1);
          ::std::__cxx11::string::string(local_35a8,psVar15);
        }
        else {
          ::std::allocator<char>::allocator();
          variantPair._62_1_ = 1;
          ::std::__cxx11::string::string(local_35a8,"",(allocator *)&variantPair.field_0x3f);
        }
        if ((variantPair._62_1_ & 1) != 0) {
          ::std::allocator<char>::~allocator((allocator<char> *)&variantPair.field_0x3f);
        }
        bVar2 = nonstd::optional_lite::
                optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::has_value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&specifier_1);
        if (bVar2) {
          pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    nonstd::optional_lite::
                    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&specifier_1);
          bVar2 = ::std::operator==(pbVar14,"__AnyType__");
          if (bVar2) {
            ::std::__cxx11::string::operator=(local_35a8,"");
          }
        }
        ::std::
        array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
        ::array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                 *)local_35f0);
        bVar2 = tokenize_variantElement
                          ((string *)((long)&primTypeName_1.field_2 + 8),
                           (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>_conflict
                            *)local_35f0);
        if (bVar2) {
          psVar15 = (string *)
                    ::std::
                    array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                    ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                                  *)local_35f0,0);
          ::std::__cxx11::string::string
                    ((string *)(variantPrimName.field_2._M_local_buf + 8),psVar15);
          psVar15 = (string *)
                    ::std::
                    array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                    ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                                  *)local_35f0,1);
          ::std::__cxx11::string::string((string *)local_3810,psVar15);
          bVar2 = ValidatePrimElementName((string *)local_3810);
          if (bVar2) {
            PrimSpec::PrimSpec((PrimSpec *)&props_1._M_t._M_impl.super__Rb_tree_header._M_node_count
                              );
            psVar13 = PrimSpec::typeName_abi_cxx11_
                                ((PrimSpec *)
                                 &props_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
            ::std::__cxx11::string::operator=((string *)psVar13,local_35a8);
            psVar13 = PrimSpec::name_abi_cxx11_
                                ((PrimSpec *)
                                 &props_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
            ::std::__cxx11::string::operator=
                      ((string *)psVar13,(string *)(primTypeName_1.field_2._M_local_buf + 8));
            ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
            ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                   *)local_3f88);
            pvVar16 = crate::CrateReader::Node::GetChildren(_spec_index);
            bVar2 = BuildPropertyMap(this,pvVar16,(PathIndexToSpecIndexMap *)node,
                                     (PropertyMap *)local_3f88);
            if (bVar2) {
              pPVar17 = PrimSpec::props_abi_cxx11_
                                  ((PrimSpec *)
                                   &props_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
              ::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
              ::operator=(pPVar17,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                   *)local_3f88);
              pPVar18 = PrimSpec::metas((PrimSpec *)
                                        &props_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
              PrimMetas::operator=(pPVar18,(PrimMetas *)local_2eb8);
              sVar19 = ::std::
                       map<int,_tinyusdz::PrimSpec,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::PrimSpec>_>_>
                       ::count(&this->_variantPrimSpecs,
                               (key_type_conflict2 *)&stack0xffffffffffffffe0);
              if (sVar19 == 0) {
                this_01 = ::std::
                          map<int,_tinyusdz::PrimSpec,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::PrimSpec>_>_>
                          ::operator[](&this->_variantPrimSpecs,
                                       (key_type_conflict2 *)&stack0xffffffffffffffe0);
                PrimSpec::operator=(this_01,(PrimSpec *)
                                            &props_1._M_t._M_impl.super__Rb_tree_header.
                                             _M_node_count);
                pmVar20 = ::std::
                          map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                          ::operator[](&this->_variantPrimChildren,&level_local);
                ::std::vector<int,_std::allocator<int>_>::push_back
                          (pmVar20,(value_type_conflict7 *)&stack0xffffffffffffffe0);
              }
              cVar1 = '\0';
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_4100);
              poVar7 = ::std::operator<<((ostream *)local_4100,"[error]");
              poVar7 = ::std::operator<<(poVar7,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                        );
              poVar7 = ::std::operator<<(poVar7,"[USDC]");
              poVar7 = ::std::operator<<(poVar7,":");
              poVar7 = ::std::operator<<(poVar7,"ReconstructPrimSpecNode");
              poVar7 = ::std::operator<<(poVar7,"():");
              poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xc84);
              ::std::operator<<(poVar7," ");
              poVar7 = ::std::operator<<((ostream *)local_4100,"Failed to build PropertyMap.");
              ::std::operator<<(poVar7,"\n");
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)((long)&path.contained + 200));
              ::std::__cxx11::string::~string((string *)((long)&path.contained + 200));
              this_local._7_1_ = 0;
              cVar1 = '\x01';
              ::std::__cxx11::ostringstream::~ostringstream(local_4100);
            }
            ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
            ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                    *)local_3f88);
            PrimSpec::~PrimSpec((PrimSpec *)
                                &props_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_3988);
            poVar7 = ::std::operator<<((ostream *)local_3988,"[error]");
            poVar7 = ::std::operator<<(poVar7,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                      );
            poVar7 = ::std::operator<<(poVar7,"[USDC]");
            poVar7 = ::std::operator<<(poVar7,":");
            poVar7 = ::std::operator<<(poVar7,"ReconstructPrimSpecNode");
            poVar7 = ::std::operator<<(poVar7,"():");
            poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xc45);
            ::std::operator<<(poVar7," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_39c8,"Invalid Prim name in Variant: `{}`",&local_39c9);
            fmt::format<std::__cxx11::string>
                      (local_39a8,(string *)local_39c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3810);
            poVar7 = ::std::operator<<((ostream *)local_3988,(string *)local_39a8);
            ::std::operator<<(poVar7,"\n");
            ::std::__cxx11::string::~string((string *)local_39a8);
            ::std::__cxx11::string::~string(local_39c8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_39c9);
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)
                           &variantPrimSpec._asset_search_paths.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
            ::std::__cxx11::string::~string
                      ((string *)
                       &variantPrimSpec._asset_search_paths.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            this_local._7_1_ = 0;
            cVar1 = '\x01';
            ::std::__cxx11::ostringstream::~ostringstream(local_3988);
          }
          ::std::__cxx11::string::~string((string *)local_3810);
          ::std::__cxx11::string::~string((string *)(variantPrimName.field_2._M_local_buf + 8));
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_3768);
          poVar7 = ::std::operator<<((ostream *)local_3768,"[error]");
          poVar7 = ::std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar7 = ::std::operator<<(poVar7,"[USDC]");
          poVar7 = ::std::operator<<(poVar7,":");
          poVar7 = ::std::operator<<(poVar7,"ReconstructPrimSpecNode");
          poVar7 = ::std::operator<<(poVar7,"():");
          poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xc3c);
          ::std::operator<<(poVar7," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_37a8,"Invalid Variant ElementPath \'{}\'.",&local_37a9);
          fmt::format<tinyusdz::Path>(&local_3788,&local_37a8,(Path *)&pv_3);
          poVar7 = ::std::operator<<((ostream *)local_3768,(string *)&local_3788);
          ::std::operator<<(poVar7,"\n");
          ::std::__cxx11::string::~string((string *)&local_3788);
          ::std::__cxx11::string::~string((string *)&local_37a8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_37a9);
          ::std::__cxx11::ostringstream::str();
          PushError(this,(string *)((long)&variantSetName.field_2 + 8));
          ::std::__cxx11::string::~string((string *)(variantSetName.field_2._M_local_buf + 8));
          this_local._7_1_ = 0;
          cVar1 = '\x01';
          ::std::__cxx11::ostringstream::~ostringstream(local_3768);
        }
        ::std::
        array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
        ::~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                  *)local_35f0);
        ::std::__cxx11::string::~string(local_35a8);
        ::std::__cxx11::string::~string((string *)(primTypeName_1.field_2._M_local_buf + 8));
        if (cVar1 == '\0') {
          cVar1 = '\x0e';
        }
        ::std::__cxx11::string::~string((string *)(prim_name_1.field_2._M_local_buf + 8));
      }
LAB_001e463c:
      Path::~Path((Path *)&pv_3);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_3030);
      poVar7 = ::std::operator<<((ostream *)local_3030,"[error]");
      poVar7 = ::std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar7 = ::std::operator<<(poVar7,"[USDC]");
      poVar7 = ::std::operator<<(poVar7,":");
      poVar7 = ::std::operator<<(poVar7,"ReconstructPrimSpecNode");
      poVar7 = ::std::operator<<(poVar7,"():");
      poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xc03);
      ::std::operator<<(poVar7," ");
      poVar7 = ::std::operator<<((ostream *)local_3030,"Failed to parse Prim fields under Variant.")
      ;
      ::std::operator<<(poVar7,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)&elemPath_2._valid);
      ::std::__cxx11::string::~string((string *)&elemPath_2._valid);
      this_local._7_1_ = 0;
      cVar1 = '\x01';
      ::std::__cxx11::ostringstream::~ostringstream(local_3030);
    }
    PrimMetas::~PrimMetas((PrimMetas *)local_2eb8);
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
               ((long)&primMeta_1.variantSetChildren.contained + 0x10));
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
               &properties_1.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    nonstd::optional_lite::optional<tinyusdz::Specifier>::~optional
              ((optional<tinyusdz::Specifier> *)
               &primChildren_1.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    nonstd::optional_lite::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&specifier_1);
joined_r0x001e468d:
    if (cVar1 == '\x01') goto LAB_001e4f2e;
    break;
  case VariantSet:
    sVar9 = ::std::set<int,_std::less<int>,_std::allocator<int>_>::count
                      (&this->_prim_table,&level_local);
    if (sVar9 == 0) {
      ::std::__cxx11::ostringstream::ostringstream(local_2340);
      poVar7 = ::std::operator<<((ostream *)local_2340,"[error]");
      poVar7 = ::std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar7 = ::std::operator<<(poVar7,"[USDC]");
      poVar7 = ::std::operator<<(poVar7,":");
      poVar7 = ::std::operator<<(poVar7,"ReconstructPrimSpecNode");
      poVar7 = ::std::operator<<(poVar7,"():");
      poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xbc3);
      ::std::operator<<(poVar7," ");
      poVar7 = ::std::operator<<((ostream *)local_2340,"Parent Prim for this VariantSet not found.")
      ;
      ::std::operator<<(poVar7,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)&elemPath_1._valid);
      ::std::__cxx11::string::~string((string *)&elemPath_1._valid);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_2340);
      goto LAB_001e4f2e;
    }
    Path::Path((Path *)&pv_2);
    crate::Index::Index(&local_2514,uStack_20);
    GetElemPath(&local_2510,this,local_2514);
    local_2438 = &local_2510;
    bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_2438);
    if (bVar2) {
      pvVar11 = nonstd::optional_lite::optional<tinyusdz::Path>::value(local_2438);
      Path::operator=((Path *)&pv_2,pvVar11);
      Path::full_path_name_abi_cxx11_(&local_2538,(Path *)&pv_2);
      bVar2 = tokenize_variantElement
                        (&local_2538,
                         (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>_conflict
                          *)0x0);
      ::std::__cxx11::string::~string((string *)&local_2538);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        local_8c4 = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_26b0);
        poVar7 = ::std::operator<<((ostream *)local_26b0,"[error]");
        poVar7 = ::std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                  );
        poVar7 = ::std::operator<<(poVar7,"[USDC]");
        poVar7 = ::std::operator<<(poVar7,":");
        poVar7 = ::std::operator<<(poVar7,"ReconstructPrimSpecNode");
        poVar7 = ::std::operator<<(poVar7,"():");
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xbd4);
        ::std::operator<<(poVar7," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_26f0,"Invalid Variant ElementPath \'{}\'.",&local_26f1);
        fmt::format<tinyusdz::Path>(&local_26d0,&local_26f0,(Path *)&pv_2);
        poVar7 = ::std::operator<<((ostream *)local_26b0,(string *)&local_26d0);
        ::std::operator<<(poVar7,"\n");
        ::std::__cxx11::string::~string((string *)&local_26d0);
        ::std::__cxx11::string::~string((string *)&local_26f0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_26f1);
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_2718);
        ::std::__cxx11::string::~string((string *)&local_2718);
        this_local._7_1_ = 0;
        local_8c4 = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_26b0);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_2890);
      poVar7 = ::std::operator<<((ostream *)local_2890,"[error]");
      poVar7 = ::std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar7 = ::std::operator<<(poVar7,"[USDC]");
      poVar7 = ::std::operator<<(poVar7,":");
      poVar7 = ::std::operator<<(poVar7,"ReconstructPrimSpecNode");
      poVar7 = ::std::operator<<(poVar7,"():");
      poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xbd9);
      ::std::operator<<(poVar7," ");
      poVar7 = ::std::operator<<((ostream *)local_2890,"(Internal errror) Element path not found.");
      ::std::operator<<(poVar7,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &variantChildren.
                      super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &variantChildren.
                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      local_8c4 = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_2890);
    }
    nonstd::optional_lite::optional<tinyusdz::Path>::~optional(&local_2510);
    if (local_8c4 == 0) {
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_28c8);
      bVar2 = ParseVariantSetFields
                        (this,this_00,
                         (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_28c8);
      if (bVar2) {
        bVar2 = AddVariantChildrenToPrimNode
                          (this,level_local,
                           (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_28c8);
        if (bVar2) {
          local_8c4 = 0xe;
        }
        else {
          this_local._7_1_ = 0;
          local_8c4 = 1;
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_2a40);
        poVar7 = ::std::operator<<((ostream *)local_2a40,"[error]");
        poVar7 = ::std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                  );
        poVar7 = ::std::operator<<(poVar7,"[USDC]");
        poVar7 = ::std::operator<<(poVar7,":");
        poVar7 = ::std::operator<<(poVar7,"ReconstructPrimSpecNode");
        poVar7 = ::std::operator<<(poVar7,"():");
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xbe3);
        ::std::operator<<(poVar7," ");
        poVar7 = ::std::operator<<((ostream *)local_2a40,"Failed to parse VariantSet fields.");
        ::std::operator<<(poVar7,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)((long)&typeName_1.contained + 0x18));
        ::std::__cxx11::string::~string((string *)((long)&typeName_1.contained + 0x18));
        this_local._7_1_ = 0;
        local_8c4 = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_2a40);
      }
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_28c8);
    }
    Path::~Path((Path *)&pv_2);
    if (local_8c4 == 1) goto LAB_001e4f2e;
  }
  this_local._7_1_ = 1;
LAB_001e4f2e:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool USDCReader::Impl::ReconstructPrimSpecNode(int parent, int current, int level,
                                           bool is_parent_variant,
                                           const PathIndexToSpecIndexMap &psmap,
                                           Layer *layer,
                                           nonstd::optional<PrimSpec> *primOut) {
  (void)level;
  const crate::CrateReader::Node &node = _nodes[size_t(current)];

#ifdef TINYUSDZ_LOCAL_DEBUG_PRINT
  std::cout << pprint::Indent(uint32_t(level)) << "lv[" << level
            << "] node_index[" << current << "] " << node.GetLocalPath()
            << " ==\n";
  std::cout << pprint::Indent(uint32_t(level)) << " childs = [";
  for (size_t i = 0; i < node.GetChildren().size(); i++) {
    std::cout << node.GetChildren()[i];
    if (i != (node.GetChildren().size() - 1)) {
      std::cout << ", ";
    }
  }
  std::cout << "] (is_parent_variant = " << is_parent_variant << ")\n";
#endif

  if (!psmap.count(uint32_t(current))) {
    // No specifier assigned to this node.
    DCOUT("No specifier assigned to this node: " << current);
    return true;  // would be OK.
  }

  uint32_t spec_index = psmap.at(uint32_t(current));
  if (spec_index >= _specs.size()) {
    PUSH_ERROR("Invalid specifier id: " + std::to_string(spec_index) +
               ". Must be in range [0, " + std::to_string(_specs.size()) + ")");
    return false;
  }

  const crate::Spec &spec = _specs[spec_index];

  DCOUT(pprint::Indent(uint32_t(level))
        << "  specTy = " << to_string(spec.spec_type));
  DCOUT(pprint::Indent(uint32_t(level))
        << "  fieldSetIndex = " << spec.fieldset_index.value);

  if ((spec.spec_type == SpecType::Attribute) ||
      (spec.spec_type == SpecType::Relationship)) {
    if (_prim_table.count(parent)) {
      // This node is a Properties node. These are processed in
      // ReconstructPrim(), so nothing to do here.
      return true;
    }
  }

  if (!_live_fieldsets.count(spec.fieldset_index)) {
    PUSH_ERROR("FieldSet id: " + std::to_string(spec.fieldset_index.value) +
               " must exist in live fieldsets.");
    return false;
  }

  const crate::FieldValuePairVector &fvs =
      _live_fieldsets.at(spec.fieldset_index);

  if (fvs.size() > _config.kMaxFieldValuePairs) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too much FieldValue pairs.");
  }

#if defined(TINYUSDZ_LOCAL_DEBUG_PRINT)
  // DBG
  for (auto &fv : fvs) {
    DCOUT("parent[" << current << "] level [" << level << "] fv name "
                    << fv.first << "(type = " << fv.second.type_name() << ")");
  }
#endif

  // StageMeta = root only attributes.
  // TODO: Unify reconstrction code with USDAReder?
  if (current == 0) {
    if (const auto &pv = GetElemPath(crate::Index(uint32_t(current)))) {
      DCOUT("Root element path: " << pv.value().full_path_name());
    } else {
      PUSH_ERROR_AND_RETURN("(Internal error). Root Element Path not found.");
    }

    // Root layer(Stage) is PseudoRoot spec type.
    if (spec.spec_type != SpecType::PseudoRoot) {
      PUSH_ERROR_AND_RETURN(
          "SpecTypePseudoRoot expected for root layer(Stage) element.");
    }

    if (!ReconstrcutStageMeta(fvs, &layer->metas())) {
      PUSH_ERROR_AND_RETURN("Failed to reconstruct StageMeta.");
    }

    // TODO: Validate scene using `StageMetas::primChildren`.

    _prim_table.insert(current);

    return true;
  }

  switch (spec.spec_type) {
    case SpecType::PseudoRoot: {
      PUSH_ERROR_AND_RETURN_TAG(
          kTag, "SpecType PseudoRoot in a child node is not supported(yet)");
    }
    case SpecType::Prim: {
      nonstd::optional<std::string> typeName;
      nonstd::optional<Specifier> specifier;
      std::vector<value::token> primChildren;
      std::vector<value::token> properties;

      PrimMeta primMeta;

      DCOUT("== PrimFields begin ==> ");

      if (!ParsePrimSpec(fvs, typeName, specifier, primChildren, properties, primMeta)) {
        PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to parse Prim fields.");
        return false;
      }

      DCOUT("<== PrimFields end ===");

      Path elemPath;

      if (const auto &pv = GetElemPath(crate::Index(uint32_t(current)))) {
        DCOUT(fmt::format("Element path: {}", pv.value().full_path_name()));
        elemPath = pv.value();
      } else {
        PUSH_ERROR_AND_RETURN_TAG(kTag,
                                  "(Internal errror) Element path not found.");
      }

      // Sanity check
      if (specifier) {
        if (specifier.value() == Specifier::Def) {
          // ok
        } else if (specifier.value() == Specifier::Class) {
          // ok
        } else if (specifier.value() == Specifier::Over) {
          // ok
        } else {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid Specifier.");
        }
      } else {
        // Default = Over Prim.
        specifier = Specifier::Over;
      }

      std::string pTyName;
      if (!typeName) {
        //PUSH_WARN("Treat this node as Model(`typeName` field is missing).");
        pTyName = "Model";
      } else {
        pTyName = typeName.value();
      }

      {
        DCOUT("elemPath.prim_name = " << elemPath.prim_part());
        std::string prim_name = elemPath.prim_part();
        std::string primTypeName = typeName.has_value() ? typeName.value() : "";
        // __AnyType__
        if (typeName.has_value() && typeName.value() == "__AnyType__") {
          primTypeName = "";
        }

        // Validation check should be already done in crate-reader, so no
        // further validation required.
        if (!ValidatePrimElementName(prim_name)) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid Prim name.");
        }

        PrimSpec primspec;

#if 0
        bool is_unsupported_prim{false};
        auto prim = ReconstructPrimFromTypeName(pTyName, primTypeName, prim_name,
                                                node, specifier.value(), primChildren, properties,
                                                psmap, primMeta, &is_unsupported_prim);

        if (prim) {
          // Prim name
          prim.value().element_path() = elemPath;
        } else {
          if (_config.allow_unknown_prims && is_unsupported_prim) {
            // Try to reconsrtuct as Model
            prim = ReconstructPrimFromTypeName("Model", primTypeName, prim_name,
                                                    node, specifier.value(), primChildren, properties,
                                                    psmap, primMeta);
            if (prim) {
              // Prim name
              prim.value().element_path() = elemPath;
            } else {
              return false;
            }
          } else {
            return false;
          }
        }
#else
        primspec.typeName() = primTypeName;
        primspec.name() = prim_name;

        prim::PropertyMap props;
        if (!BuildPropertyMap(node.GetChildren(), psmap, &props)) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to build PropertyMap.");
        }
        primspec.props() = props;
        primspec.metas() = primMeta;
        // TODO: primChildren, properties

        if (primOut) {
          (*primOut) = primspec;
        }
#endif
      }

      DCOUT("add prim idx " << current);
      if (_prim_table.count(current)) {
        DCOUT("??? prim idx already set " << current);
      } else {
        _prim_table.insert(current);
      }

      break;
    }
    case SpecType::VariantSet: {
      // Assume parent(Prim) already exists(parsed)
      // TODO: Confirm Crate format allow defining Prim after VariantSet
      // serialization.
      if (!_prim_table.count(parent)) {
        PUSH_ERROR_AND_RETURN_TAG(kTag,
                                  "Parent Prim for this VariantSet not found.");
      }

      DCOUT(
          fmt::format("[{}] is a Variantset node(parent = {}). prim_idx? = {}",
                      current, parent, _prim_table.count(current)));

      Path elemPath;

      if (const auto &pv = GetElemPath(crate::Index(uint32_t(current)))) {
        elemPath = pv.value();

        DCOUT(fmt::format("Element path: {}", dump_path(elemPath)));

        // Ensure ElementPath is variant
        if (!tokenize_variantElement(elemPath.full_path_name())) {
          PUSH_ERROR_AND_RETURN_TAG(
              kTag, fmt::format("Invalid Variant ElementPath '{}'.", elemPath));
        }

      } else {
        PUSH_ERROR_AND_RETURN_TAG(kTag,
                                  "(Internal errror) Element path not found.");
      }

      std::vector<value::token> variantChildren;

      // Only contains `variantChildren` field with type `token[]`

      DCOUT("== VariantSetFields begin ==> ");

      if (!ParseVariantSetFields(fvs, variantChildren)) {
        PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to parse VariantSet fields.");
        return false;
      }

      DCOUT("<== VariantSetFields end === ");

      // Add variantChildren to prim node.
      // TODO: elemPath
      if (!AddVariantChildrenToPrimNode(parent, variantChildren)) {
        return false;
      }

      break;
    }
    case SpecType::Variant: {
      // Since the Prim this Variant node belongs to is not yet reconstructed
      // during the Prim tree traversal, We manage variant node separately

      DCOUT(fmt::format("[{}] is a Variant node(parent = {}). prim_idx? = {}",
                        current, parent, _prim_table.count(current)));

      nonstd::optional<std::string> typeName;
      nonstd::optional<Specifier> specifier;
      std::vector<value::token> primChildren;
      std::vector<value::token> properties;

      PrimMeta primMeta;

      DCOUT("== VariantFields begin ==> ");

      if (!ParsePrimSpec(fvs, typeName, specifier, primChildren, properties, primMeta)) {
        PUSH_ERROR_AND_RETURN_TAG(kTag,
                                  "Failed to parse Prim fields under Variant.");
        return false;
      }

      DCOUT("<== VariantFields end === ");

      Path elemPath;
      if (const auto &pv = GetElemPath(crate::Index(uint32_t(current)))) {
        elemPath = pv.value();
        DCOUT(fmt::format("Element path: {}", elemPath.full_path_name()));
      } else {
        PUSH_ERROR_AND_RETURN_TAG(kTag,
                                  "(Internal errror) Element path not found.");
      }

      // Sanity check
      if (specifier) {
        if (specifier.value() == Specifier::Def) {
          // ok
        } else if (specifier.value() == Specifier::Class) {
          // ok
        } else if (specifier.value() == Specifier::Over) {
          // ok
        } else {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid Specifier.");
        }
      } else {
        // Seems Variant is only composed of Properties.
        // Create pseudo `def` Prim
        // FIXME: default is `Over`?
        specifier = Specifier::Def;
      }

      std::string pTyName; // TinyUSDZ' prim typename
      if (!typeName) {
        //PUSH_WARN("Treat this node as Model(where `typeName` is missing).");
        pTyName = "Model";
      } else {
        pTyName = typeName.value();
      }

      {
        std::string prim_name = elemPath.prim_part();
        DCOUT("elemPath = " << dump_path(elemPath));
        DCOUT("prim_name = " << prim_name);

        std::string primTypeName = typeName.has_value() ? typeName.value() : "";
        // __AnyType__
        if (typeName.has_value() && typeName.value() == "__AnyType__") {
          primTypeName = "";
        }

        // Something like '{shapeVariant=Capsule}'

        std::array<std::string, 2> variantPair;
        if (!tokenize_variantElement(prim_name, &variantPair)) {
          PUSH_ERROR_AND_RETURN_TAG(
              kTag, fmt::format("Invalid Variant ElementPath '{}'.", elemPath));
        }

        std::string variantSetName = variantPair[0];
        std::string variantPrimName = variantPair[1];

        if (!ValidatePrimElementName(variantPrimName)) {
          PUSH_ERROR_AND_RETURN_TAG(
              kTag, fmt::format("Invalid Prim name in Variant: `{}`",
                                variantPrimName));
        }

#if 0
        nonstd::optional<PrimSpec> variantPrimSpec;
        bool is_unsupported_prim{false};
        variantPrim = ReconstructPrimFromTypeName(
            pTyName, primTypeName, variantPrimName, node, specifier.value(), primChildren, properties,
            psmap, primMeta, &is_unsupported_prim);

        if (variantPrim) {
          // Prim name
          variantPrim.value().element_path() =
              elemPath;  // FIXME: Use variantPrimName?

          // Prim Specifier
          variantPrim.value().specifier() = specifier.value();

          // Store variantPrim to temporary buffer.
          DCOUT(fmt::format("parent {} add prim idx {} as variant: ", parent, current));
          if (_variantPrims.count(current)) {
            DCOUT("??? prim idx already set " << current);
          } else {
            _variantPrims[current] =  variantPrim.value();
            _variantPrimChildren[parent].push_back(current);
          }
        } else {
          if (_config.allow_unknown_prims && is_unsupported_prim) {
            // Try to reconstruct as Model
            variantPrim = ReconstructPrimFromTypeName(
                "Model", primTypeName, variantPrimName, node, specifier.value(), primChildren, properties,
                psmap, primMeta);

            if (variantPrim) {
              // Prim name
              variantPrim.value().element_path() =
                  elemPath;  // FIXME: Use variantPrimName?

              // Prim Specifier
              variantPrim.value().specifier() = specifier.value();

              // Store variantPrim to temporary buffer.
              DCOUT(fmt::format("parent {} add prim idx {} as variant: ", parent, current));
              if (_variantPrims.count(current)) {
                DCOUT("??? prim idx already set " << current);
              } else {
                _variantPrims[current] = variantPrim.value();
                _variantPrimChildren[parent].push_back(current);
              }
            } else {
              return false;
            }
          } else {
            return false;
          }
        }
#else
        PrimSpec variantPrimSpec;
        variantPrimSpec.typeName() = primTypeName;
        variantPrimSpec.name() = prim_name;

        prim::PropertyMap props;
        if (!BuildPropertyMap(node.GetChildren(), psmap, &props)) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to build PropertyMap.");
        }
        variantPrimSpec.props() = props;
        variantPrimSpec.metas() = primMeta;

        // Store variantPrimSpec to temporary buffer.
        DCOUT(fmt::format("parent {} add primspec idx {} as variant: ", parent, current));
        if (_variantPrimSpecs.count(current)) {
          DCOUT("??? prim idx already set " << current);
        } else {
          _variantPrimSpecs[current] = variantPrimSpec;
          _variantPrimChildren[parent].push_back(current);
        }

#endif
      }

      break;
    }
    case SpecType::Attribute: {
      if (is_parent_variant) {
        nonstd::optional<Path> path = GetPath(spec.path_index);

        if (!path) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid PathIndex.");
        }

        Property prop;
        if (!ParseProperty(spec.spec_type, fvs, &prop)) {
          PUSH_ERROR_AND_RETURN_TAG(kTag,
                                    fmt::format("Failed to parse Attribut: {}.",
                                                path.value().prop_part()));
        }

        // Parent Prim is not yet reconstructed, so store info to temporary
        // buffer _variantAttributeNodes.
        _variantProps[current] = {path.value(), prop};
        _variantPropChildren[parent].push_back(current);

        DCOUT(
            fmt::format("parent {} current [{}] Parsed Attribute {} under Variant. PathIndex {}",
                        parent, current, path.value().prop_part(), spec.path_index));

      } else {
        // Maybe parent is Class/Over, or inherited
        PUSH_WARN(
            "TODO: SpecTypeAttribute(in conjunction with Class/Over specifier, "
            "or inherited?)");
      }
      break;
    }
    case SpecType::Connection:
    case SpecType::Relationship:
    case SpecType::RelationshipTarget: {
      PUSH_ERROR_AND_RETURN_TAG(
          kTag, fmt::format("TODO: Unsupported/Unimplemented SpecType: {}.",
                            to_string(spec.spec_type)));
      break;
    }
    case SpecType::Expression:
    case SpecType::Mapper:
    case SpecType::MapperArg: {
      PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Unsupported SpecType: {}.",
                                                  to_string(spec.spec_type)));
      break;
    }
    case SpecType::Unknown:
    case SpecType::Invalid: {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "[InternalError] Invalid SpecType.");
      break;
    }
  }

  return true;
}